

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

MIR_insn_t_conflict MIR_copy_insn(MIR_context_t ctx,MIR_insn_t_conflict insn)

{
  ulong uVar1;
  void *__dest;
  MIR_insn_t_conflict pMVar2;
  char *pcVar3;
  size_t label_num;
  MIR_context_t ctx_00;
  size_t __size;
  
  if (insn == (MIR_insn_t_conflict)0x0) {
    __assert_fail("insn != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x92b,"MIR_insn_t MIR_copy_insn(MIR_context_t, MIR_insn_t)");
  }
  uVar1 = *(ulong *)&insn->field_0x18;
  __size = 0x50;
  if (uVar1 >> 0x20 != 0) {
    __size = (ulong)((int)(uVar1 >> 0x20) - 1) * 0x30 + 0x50;
  }
  __dest = malloc(__size);
  if (__dest != (void *)0x0) {
    pMVar2 = (MIR_insn_t_conflict)memcpy(__dest,insn,__size);
    return pMVar2;
  }
  if ((uint)uVar1 < 0xbc) {
    pcVar3 = insn_descs[uVar1 & 0xff].name;
  }
  else {
    pcVar3 = "";
  }
  ctx_00 = (MIR_context_t)0x3;
  (*ctx->error_func)(MIR_alloc_error,"Not enough memory to copy insn %s",pcVar3);
  label_num = ctx_00->curr_label_num + 1;
  ctx_00->curr_label_num = label_num;
  pMVar2 = create_label(ctx_00,label_num);
  return pMVar2;
}

Assistant:

MIR_insn_t MIR_copy_insn (MIR_context_t ctx, MIR_insn_t insn) {
  size_t size;
  mir_assert (insn != NULL);
  size = sizeof (struct MIR_insn) + sizeof (MIR_op_t) * (insn->nops == 0 ? 0 : insn->nops - 1);
  MIR_insn_t new_insn = malloc (size);

  if (new_insn == NULL)
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory to copy insn %s",
                              insn_name (insn->code));
  memcpy (new_insn, insn, size);
  return new_insn;
}